

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O3

int onig_regset_replace(OnigRegSet *set,int at,regex_t *reg)

{
  int iVar1;
  OnigRegion *pOVar2;
  RR *pRVar3;
  uint uVar4;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar5;
  
  iVar7 = -0x1e;
  if (-1 < at) {
    uVar5 = (ulong)(uint)at;
    if (at < set->n) {
      if (reg == (regex_t *)0x0) {
        onig_region_free(set->rs[uVar5].region,1);
        iVar1 = set->n;
        iVar7 = iVar1 + -1;
        if (at < iVar7) {
          pRVar3 = set->rs + uVar5;
          do {
            pOVar2 = pRVar3[1].region;
            pRVar3->reg = pRVar3[1].reg;
            pRVar3->region = pOVar2;
            uVar4 = (int)uVar5 + 1;
            uVar5 = (ulong)uVar4;
            pRVar3 = pRVar3 + 1;
          } while ((int)uVar4 < iVar7);
        }
        set->n = iVar7;
        if (iVar1 < 2) {
          return 0;
        }
      }
      else {
        if ((reg->options & 0x10) != 0) {
          return -0x1e;
        }
        if ((1 < (uint)set->n) && (reg->enc != set->enc)) {
          return -0x1e;
        }
        set->rs[uVar5].reg = reg;
      }
      iVar7 = 0;
      lVar8 = 0;
      lVar6 = 0;
      do {
        update_regset_by_reg(set,*(regex_t **)((long)&set->rs->reg + lVar8));
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar6 < set->n);
    }
  }
  return iVar7;
}

Assistant:

extern int
onig_regset_replace(OnigRegSet* set, int at, regex_t* reg)
{
  int i;

  if (at < 0 || at >= set->n)
    return ONIGERR_INVALID_ARGUMENT;

  if (IS_NULL(reg)) {
    onig_region_free(set->rs[at].region, 1);
    for (i = at; i < set->n - 1; i++) {
      set->rs[i].reg    = set->rs[i+1].reg;
      set->rs[i].region = set->rs[i+1].region;
    }
    set->n--;
  }
  else {
#ifdef USE_FIND_LONGEST_SEARCH_ALL_OF_RANGE
    if (OPTON_FIND_LONGEST(reg->options))
      return ONIGERR_INVALID_ARGUMENT;
#endif

    if (set->n > 1 && reg->enc != set->enc)
      return ONIGERR_INVALID_ARGUMENT;

    set->rs[at].reg = reg;
  }

  for (i = 0; i < set->n; i++)
    update_regset_by_reg(set, set->rs[i].reg);

  return 0;
}